

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::CheckDoString(Debugger *this)

{
  lua_State *L_00;
  dll_luaL_loadstring p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *code;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int t;
  bool skip;
  lua_State *L;
  Debugger *this_local;
  
  if (this->currentL != (lua_State *)0x0) {
    L_00 = this->currentL;
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->doStringList);
    if (!bVar2) {
      bVar2 = this->skipHook;
      this->skipHook = true;
      iVar4 = (*lua_gettop)(L_00);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->doStringList);
      code = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->doStringList);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&code), bVar3) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&__end2);
        p_Var1 = luaL_loadstring;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iVar5 = (*p_Var1)(L_00,pcVar6);
        if (iVar5 == 0) {
          lua_pcall(L_00,0,0,0);
        }
        (*lua_settop)(L_00,iVar4);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      this->skipHook = (bool)(bVar2 & 1);
      iVar5 = (*lua_gettop)(L_00);
      if (iVar5 != iVar4) {
        __assert_fail("lua_gettop(L) == t",
                      "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                      ,0x371,"void Debugger::CheckDoString()");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->doStringList);
    }
  }
  return;
}

Assistant:

void Debugger::CheckDoString() {
	if (!currentL) {
		return;
	}

	auto L = currentL;


	if (!doStringList.empty()) {
		const auto skip = skipHook;
		skipHook = true;
		const int t = lua_gettop(L);
		for (const auto &code: doStringList) {
			const int r = luaL_loadstring(L, code.c_str());
			if (r == LUA_OK) {
				lua_pcall(L, 0, 0, 0);
			}
			lua_settop(L, t);
		}
		skipHook = skip;
		assert(lua_gettop(L) == t);
		doStringList.clear();
	}
}